

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O2

ShaderCodeBufferDesc * __thiscall
Diligent::ShaderGLImpl::GetConstantBufferDesc(ShaderGLImpl *this,Uint32 Index)

{
  Uint32 UVar1;
  ShaderCodeBufferDesc *pSVar2;
  char (*in_R8) [18];
  Uint32 Index_local;
  string msg;
  
  Index_local = Index;
  if ((this->m_Builder)._M_t.
      super___uniq_ptr_impl<Diligent::ShaderGLImpl::ShaderBuilder,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::ShaderGLImpl::ShaderBuilder_*,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
      .super__Head_base<0UL,_Diligent::ShaderGLImpl::ShaderBuilder_*,_false>._M_head_impl !=
      (ShaderBuilder *)0x0) {
    FormatString<char[109]>
              (&msg,(char (*) [109])
                    "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetConstantBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x1aa);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((((this->super_ShaderBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
       .m_pDevice)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Features.
      SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[87]>
              (&msg,(char (*) [87])
                    "Shader resource queries are not available when separate shader objects are unsupported"
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
    }
  }
  else {
    UVar1 = GetResourceCount(this);
    if (Index < UVar1) {
      pSVar2 = ShaderResourcesGL::GetUniformBufferDesc
                         ((this->m_pShaderResources).
                          super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,Index);
      return pSVar2;
    }
    FormatString<char[24],unsigned_int,char[18]>
              (&msg,(Diligent *)"Constant buffer index (",(char (*) [24])&Index_local,
               (uint *)") is out of range",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetConstantBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x1b0);
  }
  std::__cxx11::string::~string((string *)&msg);
  return (ShaderCodeBufferDesc *)0x0;
}

Assistant:

const ShaderCodeBufferDesc* ShaderGLImpl::GetConstantBufferDesc(Uint32 Index) const
{
    DEV_CHECK_ERR(!m_Builder, "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");

    if (m_pDevice->GetFeatures().SeparablePrograms)
    {
        if (Index >= GetResourceCount())
        {
            UNEXPECTED("Constant buffer index (", Index, ") is out of range");
            return nullptr;
        }

        // Uniform buffers always go first in the list of resources
        return m_pShaderResources->GetUniformBufferDesc(Index);
    }
    else
    {
        LOG_WARNING_MESSAGE("Shader resource queries are not available when separate shader objects are unsupported");
        return nullptr;
    }
}